

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStdio.cpp
# Opt level: O0

void __thiscall
adios2::transport::FileStdio::Write(FileStdio *this,char *buffer,size_t size,size_t start)

{
  ulong uVar1;
  long in_RCX;
  ulong in_RDX;
  string *in_RDI;
  FileStdio *unaff_retaddr;
  size_t b;
  size_t position;
  size_t remainder;
  size_t batches;
  size_t in_stack_00000080;
  char *in_stack_00000088;
  anon_class_8_1_8991fb9c *in_stack_00000090;
  int status;
  anon_class_8_1_8991fb9c lf_Write;
  char *in_stack_fffffffffffffe20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe28;
  ulong local_1b8;
  unsigned_long in_stack_fffffffffffffe58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  int commRank;
  string *in_stack_fffffffffffffe68;
  FileStdio *in_stack_fffffffffffffe70;
  undefined8 in_stack_fffffffffffffe78;
  undefined8 in_stack_fffffffffffffe80;
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [39];
  undefined1 local_b1 [40];
  allocator local_89;
  string local_88 [55];
  allocator local_51;
  string local_50 [36];
  int local_2c;
  long local_20;
  ulong local_18;
  string *hint;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  hint = in_RDI;
  WaitForOpen(in_stack_fffffffffffffe70);
  if (local_20 != -1) {
    local_2c = fseek((FILE *)in_RDI[7].field_2._M_allocated_capacity,local_20,0);
    if (local_2c != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_50,"Toolkit",&local_51);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_88,"transport::file::FileStdio",&local_89);
      in_stack_fffffffffffffe28 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_b1 + 1),"Write",(allocator *)in_stack_fffffffffffffe28);
      std::operator+((char *)in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
      commRank = (int)((ulong)in_stack_fffffffffffffe60 >> 0x20);
      std::operator+(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
      helper::Throw<std::ios_base::failure[abi:cxx11]>
                ((string *)in_stack_fffffffffffffe80,(string *)in_stack_fffffffffffffe78,
                 (string *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,commRank);
      std::__cxx11::string::~string(local_d8);
      std::__cxx11::string::~string(local_f8);
      std::__cxx11::string::~string((string *)(local_b1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_b1);
      std::__cxx11::string::~string(local_88);
      std::allocator<char>::~allocator((allocator<char> *)&local_89);
      std::__cxx11::string::~string(local_50);
      std::allocator<char>::~allocator((allocator<char> *)&local_51);
    }
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &stack0xfffffffffffffe68;
    std::__cxx11::to_string(in_stack_fffffffffffffe58);
    std::operator+((char *)in_stack_fffffffffffffe28,__rhs);
    std::operator+(in_stack_fffffffffffffe28,(char *)__rhs);
    std::operator+(in_stack_fffffffffffffe28,__rhs);
    std::operator+(in_stack_fffffffffffffe28,(char *)__rhs);
    CheckFile(unaff_retaddr,hint);
    std::__cxx11::string::~string(local_118);
    std::__cxx11::string::~string(local_138);
    std::__cxx11::string::~string(local_158);
    std::__cxx11::string::~string(local_178);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe68);
  }
  if (local_18 < 0x7ffe7001) {
    Write::anon_class_8_1_8991fb9c::operator()
              (in_stack_00000090,in_stack_00000088,in_stack_00000080);
  }
  else {
    uVar1 = local_18 / 0x7ffe7000;
    for (local_1b8 = 0; local_1b8 < uVar1; local_1b8 = local_1b8 + 1) {
      Write::anon_class_8_1_8991fb9c::operator()
                (in_stack_00000090,in_stack_00000088,in_stack_00000080);
    }
    Write::anon_class_8_1_8991fb9c::operator()
              (in_stack_00000090,in_stack_00000088,in_stack_00000080);
  }
  return;
}

Assistant:

void FileStdio::Write(const char *buffer, size_t size, size_t start)
{
    auto lf_Write = [&](const char *buffer, size_t size) {
        ProfilerStart("write");
        const auto writtenSize = std::fwrite(buffer, sizeof(char), size, m_File);
        ProfilerStop("write");

        CheckFile("couldn't write to file " + m_Name + ", in call to stdio fwrite");

        if (writtenSize != size)
        {
            helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileStdio", "Write",
                                                  "written size + " + std::to_string(writtenSize) +
                                                      " is not equal to intended size " +
                                                      std::to_string(size) + " in file " + m_Name +
                                                      ", in call to stdio fwrite");
        }
    };

    WaitForOpen();
    if (start != MaxSizeT)
    {
        const auto status = std::fseek(m_File, static_cast<long int>(start), SEEK_SET);
        if (status != 0)
        {
            helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileStdio", "Write",
                                                  "couldn't move position of " + m_Name +
                                                      " file, in call to FileStdio Write fseek");
        }

        CheckFile("couldn't move to start position " + std::to_string(start) + " in file " +
                  m_Name + ", in call to stdio fseek at write ");
    }

    if (size > DefaultMaxFileBatchSize)
    {
        const size_t batches = size / DefaultMaxFileBatchSize;
        const size_t remainder = size % DefaultMaxFileBatchSize;

        size_t position = 0;
        for (size_t b = 0; b < batches; ++b)
        {
            lf_Write(&buffer[position], DefaultMaxFileBatchSize);
            position += DefaultMaxFileBatchSize;
        }
        lf_Write(&buffer[position], remainder);
    }
    else
    {
        lf_Write(buffer, size);
    }
}